

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadEffectColor(ColladaParser *this,aiColor4D *pColor,Sampler *pSampler)

{
  Assimp AVar1;
  Sampler *pSVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Assimp *pAVar5;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char *pcVar6;
  undefined1 check_comma;
  _func_int *p_Var7;
  string curElem;
  allocator local_81;
  Sampler *local_80;
  string *local_78;
  aiColor4D *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined4 extraout_var_06;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar3 == '\0') {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string((string *)local_50,(char *)CONCAT44(extraout_var,iVar3),&local_81);
    local_78 = &pSampler->mUVChannel;
    local_58 = &pColor->g;
    local_60 = &pColor->b;
    local_68 = &pColor->a;
    local_80 = pSampler;
    local_70 = pColor;
LAB_0041e22d:
    do {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar3 == '\0') break;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      p_Var7 = this->mReader->_vptr_IIrrXMLReader[3];
      if (iVar3 == 1) {
        iVar3 = (*p_Var7)();
        check_comma = SUB81(p_Var7,0);
        if (iVar3 == 1) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"color");
          if (iVar3 == 0) {
            pAVar5 = (Assimp *)GetTextContent(this);
            pAVar5 = (Assimp *)
                     fast_atoreal_move<float>(pAVar5,(char *)pColor,(float *)0x1,(bool)check_comma);
            while( true ) {
              AVar1 = *pAVar5;
              if ((0x20 < (ulong)(byte)AVar1) ||
                 ((0x100002600U >> ((ulong)(byte)AVar1 & 0x3f) & 1) == 0)) break;
              pAVar5 = pAVar5 + 1;
            }
            pAVar5 = (Assimp *)
                     fast_atoreal_move<float>(pAVar5,(char *)local_58,(float *)0x1,(bool)AVar1);
            while( true ) {
              AVar1 = *pAVar5;
              if ((0x20 < (ulong)(byte)AVar1) ||
                 ((0x100002600U >> ((ulong)(byte)AVar1 & 0x3f) & 1) == 0)) break;
              pAVar5 = pAVar5 + 1;
            }
            pAVar5 = (Assimp *)
                     fast_atoreal_move<float>(pAVar5,(char *)local_60,(float *)0x1,(bool)AVar1);
            while( true ) {
              AVar1 = *pAVar5;
              if ((0x20 < (ulong)(byte)AVar1) ||
                 ((0x100002600U >> ((ulong)(byte)AVar1 & 0x3f) & 1) == 0)) break;
              pAVar5 = pAVar5 + 1;
            }
            fast_atoreal_move<float>(pAVar5,(char *)local_68,(float *)0x1,(bool)AVar1);
            TestClosing(this,"color");
            goto LAB_0041e22d;
          }
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 == 1) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"texture");
            if (iVar3 == 0) {
              GetAttribute(this,"texture");
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
              pSVar2 = local_80;
              pcVar6 = (char *)(local_80->mName)._M_string_length;
              strlen((char *)CONCAT44(extraout_var_04,iVar3));
              std::__cxx11::string::_M_replace
                        ((ulong)pSVar2,0,pcVar6,CONCAT44(extraout_var_04,iVar3));
              iVar3 = TestAttribute(this,"texcoord");
              if (-1 < iVar3) {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])();
                pcVar6 = (char *)(local_80->mUVChannel)._M_string_length;
                strlen((char *)CONCAT44(extraout_var_05,iVar3));
                std::__cxx11::string::_M_replace
                          ((ulong)local_78,0,pcVar6,CONCAT44(extraout_var_05,iVar3));
              }
              local_70->r = 1.0;
              local_70->g = 1.0;
              local_70->b = 1.0;
              local_70->a = 1.0;
              pColor = local_70;
              goto LAB_0041e22d;
            }
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 == 1) {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"technique");
              if (iVar3 == 0) {
                uVar4 = GetAttribute(this,"profile");
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
                pcVar6 = (char *)CONCAT44(extraout_var_06,iVar3);
                iVar3 = strcmp(pcVar6,"MAYA");
                if (((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"MAX3D"), iVar3 == 0)) ||
                   (iVar3 = strcmp(pcVar6,"OKINO"), iVar3 == 0)) {
                  ReadSamplerProperties(this,local_80);
                }
                else {
                  SkipElement(this);
                }
                goto LAB_0041e22d;
              }
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar3 == 1) {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"extra");
                if (iVar3 != 0) {
                  SkipElement(this);
                }
                goto LAB_0041e22d;
              }
            }
          }
        }
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar3 = (*p_Var7)();
      if (iVar3 != 2) goto LAB_0041e22d;
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = std::__cxx11::string::compare((char *)local_50);
    } while (iVar3 != 0);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectColor(aiColor4D& pColor, Sampler& pSampler)
{
    if (mReader->isEmptyElement())
        return;

    // Save current element name
    const std::string curElem = mReader->getNodeName();

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("color"))
            {
                // text content contains 4 floats
                const char* content = GetTextContent();

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.r);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.g);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.b);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pColor.a);
                SkipSpacesAndLineEnd(&content);
                TestClosing("color");
            }
            else if (IsElement("texture"))
            {
                // get name of source texture/sampler
                int attrTex = GetAttribute("texture");
                pSampler.mName = mReader->getAttributeValue(attrTex);

                // get name of UV source channel. Specification demands it to be there, but some exporters
                // don't write it. It will be the default UV channel in case it's missing.
                attrTex = TestAttribute("texcoord");
                if (attrTex >= 0)
                    pSampler.mUVChannel = mReader->getAttributeValue(attrTex);
                //SkipElement();

                // as we've read texture, the color needs to be 1,1,1,1
                pColor = aiColor4D(1.f, 1.f, 1.f, 1.f);
            }
            else if (IsElement("technique"))
            {
                const int _profile = GetAttribute("profile");
                const char* profile = mReader->getAttributeValue(_profile);

                // Some extensions are quite useful ... ReadSamplerProperties processes
                // several extensions in MAYA, OKINO and MAX3D profiles.
                if (!::strcmp(profile, "MAYA") || !::strcmp(profile, "MAX3D") || !::strcmp(profile, "OKINO"))
                {
                    // get more information on this sampler
                    ReadSamplerProperties(pSampler);
                }
                else SkipElement();
            }
            else if (!IsElement("extra"))
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (mReader->getNodeName() == curElem)
                break;
        }
    }
}